

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaPf.c
# Opt level: O3

int Pf_ManPrepareCuts(Pf_Cut_t *pCuts,Pf_Man_t *p,int iObj,int fAddUnit)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  uint uVar5;
  int iVar6;
  uint *puVar7;
  word wVar8;
  ulong uVar9;
  Pf_Cut_t *pPVar10;
  int iVar11;
  
  if ((-1 < iObj) && (iObj < (p->vCutSets).nSize)) {
    uVar2 = (p->vCutSets).pArray[(uint)iObj];
    if ((int)uVar2 < 1) {
      pCuts->Delay = 0;
      pCuts->Flow = 0.0;
      *(uint *)&pCuts->field_0x10 = *(uint *)&pCuts->field_0x10 & 0x4000000 | 0x8000002;
      pCuts->pLeaves[0] = iObj;
      pCuts->Sign = 1L << ((byte)iObj & 0x3f);
      iVar6 = 1;
    }
    else {
      if ((p->vPages).nSize <= (int)(uVar2 >> 0x10)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar4 = (p->vPages).pArray[uVar2 >> 0x10];
      iVar6 = *(int *)((long)pvVar4 + (ulong)(uVar2 & 0xffff) * 4);
      pPVar10 = pCuts;
      if (0 < iVar6) {
        piVar1 = (int *)((long)pvVar4 + (ulong)(uVar2 & 0xffff) * 4);
        puVar7 = (uint *)(piVar1 + 1);
        iVar11 = 0;
        do {
          pPVar10->Delay = 0;
          pPVar10->Flow = 0.0;
          uVar5 = *puVar7 >> 5 & 0x3ffffff;
          uVar2 = *(uint *)&pPVar10->field_0x10;
          *(uint *)&pPVar10->field_0x10 = uVar2 & 0xfc000000 | uVar5;
          uVar3 = *puVar7;
          *(uint *)&pPVar10->field_0x10 = uVar2 & 0x4000000 | uVar5 | uVar3 << 0x1b;
          if ((*puVar7 & 0x1f) == 0) {
            wVar8 = 0;
          }
          else {
            uVar9 = 0;
            wVar8 = 0;
            do {
              wVar8 = wVar8 | 1L << ((ulong)(byte)(puVar7 + 1)[uVar9] & 0x3f);
              uVar9 = uVar9 + 1;
            } while (((ulong)*puVar7 & 0x1f) != uVar9);
          }
          pPVar10->Sign = wVar8;
          *(uint *)&pPVar10->field_0x10 =
               (uint)(p->vTt2Match->nSize <= (int)(uVar5 >> 1)) << 0x1a | uVar5 | uVar3 << 0x1b;
          memcpy(pPVar10->pLeaves,puVar7 + 1,(ulong)((*puVar7 & 0x1f) << 2));
          pPVar10 = pPVar10 + 1;
          iVar11 = iVar11 + 1;
          puVar7 = puVar7 + (ulong)(*puVar7 & 0x1f) + 1;
          iVar6 = *piVar1;
        } while (iVar11 < iVar6);
      }
      if ((fAddUnit != 0) && (0xfffffff < *(uint *)&pCuts->field_0x10)) {
        pPVar10->Delay = 0;
        pPVar10->Flow = 0.0;
        *(uint *)&pPVar10->field_0x10 = *(uint *)&pPVar10->field_0x10 & 0x4000000 | 0x8000002;
        pPVar10->pLeaves[0] = iObj;
        pPVar10->Sign = 1L << ((byte)iObj & 0x3f);
        iVar6 = iVar6 + 1;
      }
    }
    return iVar6;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

static inline int Pf_ManPrepareCuts( Pf_Cut_t * pCuts, Pf_Man_t * p, int iObj, int fAddUnit )
{
    if ( Pf_ObjHasCuts(p, iObj) )
    {
        Pf_Cut_t * pMfCut = pCuts;
        int i, * pCut, * pList = Pf_ObjCutSet(p, iObj);
        Pf_SetForEachCut( pList, pCut, i )
        {
            pMfCut->Delay   = 0;
            pMfCut->Flow    = 0;
            pMfCut->iFunc   = Pf_CutFunc( pCut );
            pMfCut->nLeaves = Pf_CutSize( pCut );
            pMfCut->Sign    = Pf_CutGetSign( pCut+1, Pf_CutSize(pCut) );
            pMfCut->Useless = Pf_ObjCutUseless( p, Abc_Lit2Var(pMfCut->iFunc) );
            memcpy( pMfCut->pLeaves, pCut+1, sizeof(int) * Pf_CutSize(pCut) );
            pMfCut++;
        }
        if ( fAddUnit && pCuts->nLeaves > 1 )
            return pList[0] + Pf_CutCreateUnit( pMfCut, iObj );
        return pList[0];
    }
    return Pf_CutCreateUnit( pCuts, iObj );
}